

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O3

int Wlc_NtkPairIsUifable(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Wlc_Obj_t *pObj2)

{
  Wlc_Obj_t *pWVar1;
  uint uVar2;
  int iVar3;
  Wlc_Obj_t *pWVar4;
  int iVar5;
  int iVar6;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar7;
  ulong uVar8;
  long lVar9;
  
  iVar5 = pObj->End - pObj->Beg;
  iVar3 = -iVar5;
  if (0 < iVar5) {
    iVar3 = iVar5;
  }
  iVar6 = pObj2->End - pObj2->Beg;
  iVar5 = -iVar6;
  if (0 < iVar6) {
    iVar5 = iVar6;
  }
  iVar6 = 0;
  if (iVar3 == iVar5) {
    if (((*(ushort *)pObj2 ^ *(ushort *)pObj) & 0x40) == 0) {
      uVar2 = pObj->nFanins;
      if (uVar2 == pObj2->nFanins) {
        if (0 < (int)uVar2) {
          uVar8 = 0;
          do {
            if ((2 < uVar2) || (paVar7 = &pObj->field_10, (*(ushort *)pObj & 0x3f | 0x10) == 0x16))
            {
              paVar7 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
            }
            iVar3 = paVar7->Fanins[uVar8];
            if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) {
LAB_0037bb9d:
              __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                            ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
            }
            if ((2 < uVar2) || (paVar7 = &pObj2->field_10, (*(ushort *)pObj2 & 0x3f | 0x10) == 0x16)
               ) {
              paVar7 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj2->field_10).pFanins[0];
            }
            lVar9 = (long)paVar7->Fanins[uVar8];
            if ((lVar9 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar7->Fanins[uVar8]))
            goto LAB_0037bb9d;
            pWVar4 = p->pObjs;
            pWVar1 = pWVar4 + iVar3;
            iVar5 = pWVar1->End - pWVar1->Beg;
            iVar3 = -iVar5;
            if (0 < iVar5) {
              iVar3 = iVar5;
            }
            iVar6 = pWVar4[lVar9].End - pWVar4[lVar9].Beg;
            iVar5 = -iVar6;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            if (iVar3 != iVar5) {
              return 0;
            }
            if (((*(ushort *)(pWVar4 + lVar9) ^ *(ushort *)pWVar1) & 0x40) != 0) {
              return 0;
            }
            uVar8 = uVar8 + 1;
          } while (uVar2 != uVar8);
        }
        iVar6 = 1;
      }
    }
  }
  return iVar6;
}

Assistant:

int Wlc_NtkPairIsUifable( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Wlc_Obj_t * pObj2 )
{
    Wlc_Obj_t * pFanin, * pFanin2;  int k;
    if ( Wlc_ObjRange(pObj) != Wlc_ObjRange(pObj2) )
        return 0;
    if ( Wlc_ObjIsSigned(pObj) != Wlc_ObjIsSigned(pObj2) )
        return 0;
    if ( Wlc_ObjFaninNum(pObj) != Wlc_ObjFaninNum(pObj2) )
        return 0;
    for ( k = 0; k < Wlc_ObjFaninNum(pObj); k++ )
    {
        pFanin = Wlc_ObjFanin(p, pObj, k);
        pFanin2 = Wlc_ObjFanin(p, pObj2, k);
        if ( Wlc_ObjRange(pFanin) != Wlc_ObjRange(pFanin2) )
            return 0;
        if ( Wlc_ObjIsSigned(pFanin) != Wlc_ObjIsSigned(pFanin2) )
            return 0;
    }
    return 1;
}